

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::ForStmt::ForStmt(ForStmt *this,string *iter_var_name,int64_t start,int64_t end,int64_t step)

{
  element_type *peVar1;
  undefined1 local_60 [16];
  int64_t start_local;
  int64_t end_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  byte local_31;
  bool sign;
  
  local_60._8_8_ = start;
  start_local = end;
  Stmt::Stmt(&this->super_Stmt,For);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b5410;
  (this->iter_).super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->iter_).super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->start_ = start;
  this->end_ = end;
  this->step_ = step;
  (this->loop_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->loop_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->gen_var_stmts_).
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gen_var_stmts_).
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gen_var_stmts_).
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_31 = (byte)((byte)((ulong)start >> 0x38) | (byte)((ulong)end >> 0x38)) >> 7;
  local_60._0_8_ = (pointer)0x0;
  std::make_shared<kratos::IterVar,decltype(nullptr),std::__cxx11::string_const&,long&,long&,bool&>
            ((void **)&end_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
             (long *)iter_var_name,(long *)(local_60 + 8),(bool *)&start_local);
  std::__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->iter_).super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> *)&end_local);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::make_shared<kratos::ScopedStmtBlock>();
  std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->loop_body_).
              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)&end_local);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  peVar1 = (this->loop_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar1,this);
  return;
}

Assistant:

ForStmt::ForStmt(const std::string &iter_var_name, int64_t start, int64_t end, int64_t step)
    : Stmt(StatementType::For), start_(start), end_(end), step_(step) {
    // making a loop variable
    // first determine if it is signed or not
    bool sign = start < 0 || end < 0;
    // the iter var used for iteration assignment
    iter_ = std::make_shared<IterVar>(nullptr, iter_var_name, start, end, sign);
    loop_body_ = std::make_shared<ScopedStmtBlock>();
    loop_body_->set_parent(this);
}